

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O1

void __thiscall ClCommandLine_NearestName_Test::TestBody(ClCommandLine_NearestName_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  string_stream output;
  string_stream errors;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option3;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option2;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d0;
  string local_5c8;
  AssertHelper local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  undefined1 local_598 [24];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_580;
  string local_560 [3];
  ios_base local_4f0 [264];
  ostringstream local_3e8 [112];
  ios_base local_378 [264];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_270;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_1a8;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_e0;
  
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[3]>(&local_e0,(char (*) [3])"aa");
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[3]>(&local_1a8,(char (*) [3])"xx");
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[3]>(&local_270,(char (*) [3])"yy");
  local_560[0]._M_dataplus._M_p = (pointer)&local_560[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"progname","");
  (anonymous_namespace)::ClCommandLine::add<char_const*>
            ((ClCommandLine *)this,local_560,"--xxx=value");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560[0]._M_dataplus._M_p != &local_560[0].field_2) {
    operator_delete(local_560[0]._M_dataplus._M_p,local_560[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
  std::__cxx11::ostringstream::ostringstream(local_3e8);
  bVar2 = anon_unknown.dwarf_26ec6::ClCommandLine::parse_command_line_options
                    (&this->super_ClCommandLine,(string_stream *)local_560,
                     (string_stream *)local_3e8);
  local_5a8.data_._0_1_ = (internal)!bVar2;
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5c8,(internal *)&local_5a8,
               (AssertionResult *)"this->parse_command_line_options (output, errors)","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_598 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xd1,local_5c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_598 + 0x10),(Message *)&local_5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_598 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    if (local_5d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5d8._M_head_impl + 8))();
    }
  }
  if (local_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5a0,local_5a0);
  }
  testing::HasSubstr<char[26]>(&local_580,(StringLike<char[26]> *)"Did you mean \'--xx=value\'");
  paVar1 = &local_5c8.field_2;
  local_5c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c8,local_580.impl_.substring_._M_dataplus._M_p,
             local_580.impl_.substring_._M_dataplus._M_p +
             local_580.impl_.substring_._M_string_length);
  local_5a8.data_ = (AssertHelperData *)local_598;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,local_5c8._M_dataplus._M_p,
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_5c8._M_string_length + (long)local_5c8._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_5d8,(char *)&local_5a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_5a8.data_ != (AssertHelperData *)local_598) {
    operator_delete(local_5a8.data_,local_598._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.impl_.substring_._M_dataplus._M_p != &local_580.impl_.substring_.field_2) {
    operator_delete(local_580.impl_.substring_._M_dataplus._M_p,
                    local_580.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_5d8._M_head_impl == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if (local_5d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_5d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_5c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_5d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5d0,local_5d0);
  }
  std::__cxx11::stringbuf::str();
  local_5d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_5c8._M_string_length;
  local_598._16_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_5a8,"output.str ().length ()","0U",(unsigned_long *)&local_5d8,
             (uint *)(local_598 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_5a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_5c8);
    if (local_5a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_5a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5d8,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_5c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5a0,local_5a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_3e8);
  std::ios_base::~ios_base(local_378);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
  std::ios_base::~ios_base(local_4f0);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_270);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_1a8);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_e0);
  return;
}

Assistant:

TEST_F (ClCommandLine, NearestName) {
    opt<std::string> option1 ("aa");
    opt<std::string> option2 ("xx");
    opt<std::string> option3 ("yy");
    this->add ("progname", "--xxx=value");

    string_stream output;
    string_stream errors;
    EXPECT_FALSE (this->parse_command_line_options (output, errors));
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Did you mean '--xx=value'")));
    EXPECT_EQ (output.str ().length (), 0U);
}